

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_cs_derived.cpp
# Opt level: O1

bool lower_cs_derived(gl_linked_shader *shader)

{
  lower_cs_derived_visitor v;
  ir_hierarchical_visitor local_88;
  gl_linked_shader *local_50;
  byte local_48;
  ir_function_signature *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  if (shader->Stage == MESA_SHADER_COMPUTE) {
    ir_hierarchical_visitor::ir_hierarchical_visitor(&local_88);
    local_88._vptr_ir_hierarchical_visitor = (_func_int **)&PTR_visit_0025c130;
    local_88._49_1_ = 0;
    local_48 = *(byte *)((long)&(shader->Program->info).field_34 + 8) & 1;
    local_38 = 0;
    uStack_30 = 0;
    local_28 = 0;
    uStack_20 = 0;
    local_18 = 0;
    local_50 = shader;
    local_40 = _mesa_get_main_function_signature(shader->symbols);
    if (local_40 == (ir_function_signature *)0x0) {
      __assert_fail("main_sig",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_cs_derived.cpp"
                    ,0x41,
                    "(anonymous namespace)::lower_cs_derived_visitor::lower_cs_derived_visitor(gl_linked_shader *)"
                   );
    }
    ir_hierarchical_visitor::run(&local_88,shader->ir);
  }
  else {
    local_88._49_1_ = 0;
  }
  return (bool)local_88._49_1_;
}

Assistant:

bool
lower_cs_derived(gl_linked_shader *shader)
{
   if (shader->Stage != MESA_SHADER_COMPUTE)
      return false;

   lower_cs_derived_visitor v(shader);
   v.run(shader->ir);

   return v.progress;
}